

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  Config *pCVar1;
  int iVar2;
  Context *pCVar3;
  undefined4 extraout_var;
  ostream *os;
  undefined4 extraout_var_00;
  Session *this_00;
  ColourGuard local_d8;
  unique_ptr<Catch::ColourImpl> colour;
  unique_ptr<Catch::IStream> errStream;
  undefined1 local_b8 [48];
  size_t local_88;
  InternalParseResult result;
  
  if (this->m_startupExceptions == false) {
    Clara::Args::Args((Args *)local_b8,argc,argv);
    Clara::Detail::ParserBase::parse(&result,(ParserBase *)this,(Args *)local_b8);
    this_00 = (Session *)(local_b8 + 0x10);
    std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base
              ((_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)this_00);
    if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type == Ok
       ) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar2 = 0;
    }
    else {
      config(this);
      pCVar3 = getCurrentMutableContext();
      pCVar3->m_config = &((this->m_config).m_ptr)->super_IConfig;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b8,"%stderr",(allocator<char> *)&local_d8);
      makeStream((Catch *)&errStream,(string *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
      makeColourImpl((Catch *)&colour,PlatformDefault,errStream.m_ptr);
      iVar2 = (*(errStream.m_ptr)->_vptr_IStream[2])(errStream.m_ptr);
      local_d8.m_colourImpl = colour.m_ptr;
      local_d8.m_code = Red;
      local_d8.m_engaged = true;
      (*(colour.m_ptr)->_vptr_ColourImpl[2])(colour.m_ptr,2);
      os = std::operator<<((ostream *)CONCAT44(extraout_var,iVar2),"\nError(s) in input:\n");
      TextFlow::Column::Column((Column *)local_b8,&result.m_errorMessage);
      local_88 = 2;
      TextFlow::operator<<(os,(Column *)local_b8);
      std::operator<<(os,"\n\n");
      std::__cxx11::string::~string((string *)local_b8);
      ColourImpl::ColourGuard::~ColourGuard(&local_d8);
      iVar2 = (*(errStream.m_ptr)->_vptr_IStream[2])(errStream.m_ptr);
      std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),"Run with -? for usage\n\n");
      std::ostream::flush();
      (*(colour.m_ptr)->_vptr_ColourImpl[1])(colour.m_ptr);
      (*(errStream.m_ptr)->_vptr_IStream[1])(errStream.m_ptr);
      iVar2 = 0xff;
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult(&result);
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }